

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::AddUtility(cmTarget *this,string *u,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48;
  
  pcVar2 = (u->_M_dataplus)._M_p;
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar2,pcVar2 + u->_M_string_length)
  ;
  if (mf == (cmMakefile *)0x0) {
    local_58 = (element_type *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    cmMakefile::GetBacktrace(mf);
  }
  paVar1 = &local_48.Value.field_2;
  if (local_78 == &local_68) {
    local_48.Value.field_2._8_8_ = local_68._8_8_;
    local_48.Value._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_48.Value._M_dataplus._M_p = (pointer)local_78;
  }
  local_48.Value.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
  local_48.Value.field_2._M_local_buf[0] = local_68._M_local_buf[0];
  local_48.Value._M_string_length = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_48.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58
  ;
  local_48.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Stack_50;
  local_58 = (element_type *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = &local_68;
  std::
  _Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
  ::_M_insert_unique<BT<std::__cxx11::string>const&>
            ((_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
              *)&this->Utilities,&local_48);
  if (local_48.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.Value._M_dataplus._M_p,local_48.Value.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void cmTarget::AddUtility(std::string const& u, cmMakefile* mf)
{
  BT<std::string> util(u, mf ? mf->GetBacktrace() : cmListFileBacktrace());
  this->Utilities.insert(util);
}